

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O0

XrResult GenValidUsageNextXrLocateSpace
                   (XrSpace space,XrSpace baseSpace,XrTime time,XrSpaceLocation *location)

{
  XrResult XVar1;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar2;
  GenValidUsageXrInstanceInfo *gen_instance_info;
  GenValidUsageXrHandleInfo *gen_space_info;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> info_with_instance;
  XrResult result;
  XrSpaceLocation *location_local;
  XrTime time_local;
  XrSpace baseSpace_local;
  XrSpace space_local;
  
  pVar2 = HandleInfo<XrSpace_T_*>::getWithInstanceInfo(&g_space_info,space);
  XVar1 = (*(pVar2.second)->dispatch_table->LocateSpace)(space,baseSpace,time,location);
  return XVar1;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL GenValidUsageNextXrLocateSpace(
    XrSpace space,
    XrSpace baseSpace,
    XrTime time,
    XrSpaceLocation* location) {
    XrResult result = XR_SUCCESS;
    try {
        auto info_with_instance = g_space_info.getWithInstanceInfo(space);
        GenValidUsageXrHandleInfo *gen_space_info = info_with_instance.first;
        (void)gen_space_info;  // quiet warnings
        GenValidUsageXrInstanceInfo *gen_instance_info = info_with_instance.second;
        result = gen_instance_info->dispatch_table->LocateSpace(space, baseSpace, time, location);
    } catch (...) {
        result = XR_ERROR_VALIDATION_FAILURE;
    }
    return result;
}